

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeUnaryOp(ExpressionContext *ctx,SynUnaryOp *syntax)

{
  ExprBase *pEVar1;
  SynUnaryOp *pSVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *pSVar6;
  char *pcVar7;
  ExprUnaryOp *pEVar8;
  TypeBase *pTVar9;
  ExpressionContext *pEVar10;
  TypeBase *local_50;
  TypeBase *resultType;
  undefined1 auStack_40 [6];
  bool logicalOp;
  bool binaryOp;
  ExprBase *local_30;
  ExprBase *result;
  ExprBase *value;
  SynUnaryOp *syntax_local;
  ExpressionContext *ctx_local;
  
  value = (ExprBase *)syntax;
  syntax_local = (SynUnaryOp *)ctx;
  result = AnalyzeExpression(ctx,syntax->value);
  bVar3 = isType<TypeError>(result->type);
  if (bVar3) {
    pEVar10 = (ExpressionContext *)
              ExpressionContext::get<ExprUnaryOp>((ExpressionContext *)syntax_local);
    pEVar1 = value;
    pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->super_TypeBase;
    ExprUnaryOp::ExprUnaryOp
              ((ExprUnaryOp *)pEVar10,(SynBase *)pEVar1,pTVar9,
               *(SynUnaryOpType *)&value[1].field_0xc,result);
    ctx_local = pEVar10;
  }
  else {
    pSVar6 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                       ((FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U> *)
                        (syntax_local + 0x193),*(int *)&value[1].field_0xc - 1);
    bVar3 = SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::contains(pSVar6,&result->type);
    pSVar2 = syntax_local;
    pEVar1 = value;
    if (!bVar3) {
      pcVar7 = GetOpName(*(SynUnaryOpType *)&value[1].field_0xc);
      InplaceStr::InplaceStr((InplaceStr *)auStack_40,pcVar7);
      local_30 = CreateFunctionCall1((ExpressionContext *)pSVar2,(SynBase *)pEVar1,_auStack_40,
                                     result,true,false,true);
      if (local_30 != (ExprBase *)0x0) {
        return local_30;
      }
      pSVar6 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                         ((FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U> *)
                          (syntax_local + 0x193),*(int *)&value[1].field_0xc - 1);
      SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert(pSVar6,&result->type);
    }
    AssertValueExpression((ExpressionContext *)syntax_local,(SynBase *)value,result);
    bVar3 = anon_unknown.dwarf_e7629::IsBinaryOp(*(SynUnaryOpType *)&value[1].field_0xc);
    bVar4 = anon_unknown.dwarf_e7629::IsLogicalOp(*(SynUnaryOpType *)&value[1].field_0xc);
    bVar5 = ExpressionContext::IsFloatingPointType((ExpressionContext *)syntax_local,result->type);
    pSVar2 = syntax_local;
    pEVar1 = value;
    if (bVar5) {
      if ((bVar3) || (bVar4)) {
        pcVar7 = GetOpName(*(SynUnaryOpType *)&value[1].field_0xc);
        anon_unknown.dwarf_e7629::Report
                  ((ExpressionContext *)pSVar2,(SynBase *)pEVar1,
                   "ERROR: unary operation \'%s\' is not supported on \'%.*s\'",pcVar7,
                   (ulong)(uint)((int)(result->type->name).end - (int)(result->type->name).begin),
                   (result->type->name).begin);
        pEVar8 = ExpressionContext::get<ExprUnaryOp>((ExpressionContext *)syntax_local);
        pEVar1 = value;
        pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->super_TypeBase
        ;
        ExprUnaryOp::ExprUnaryOp
                  (pEVar8,(SynBase *)pEVar1,pTVar9,*(SynUnaryOpType *)&value[1].field_0xc,result);
        return &pEVar8->super_ExprBase;
      }
    }
    else if ((result->type == *(TypeBase **)&syntax_local[0x1e9].super_SynBase.listed) ||
            (result->type == *(TypeBase **)&syntax_local[0x1eb].super_SynBase.typeID)) {
      if (!bVar4) {
        pcVar7 = GetOpName(*(SynUnaryOpType *)&value[1].field_0xc);
        anon_unknown.dwarf_e7629::Report
                  ((ExpressionContext *)pSVar2,(SynBase *)pEVar1,
                   "ERROR: unary operation \'%s\' is not supported on \'%.*s\'",pcVar7,
                   (ulong)(uint)((int)(result->type->name).end - (int)(result->type->name).begin),
                   (result->type->name).begin);
        pEVar8 = ExpressionContext::get<ExprUnaryOp>((ExpressionContext *)syntax_local);
        pEVar1 = value;
        pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->super_TypeBase
        ;
        ExprUnaryOp::ExprUnaryOp
                  (pEVar8,(SynBase *)pEVar1,pTVar9,*(SynUnaryOpType *)&value[1].field_0xc,result);
        return &pEVar8->super_ExprBase;
      }
    }
    else {
      bVar3 = isType<TypeRef>(result->type);
      pSVar2 = syntax_local;
      pEVar1 = value;
      if (bVar3) {
        if (!bVar4) {
          pcVar7 = GetOpName(*(SynUnaryOpType *)&value[1].field_0xc);
          anon_unknown.dwarf_e7629::Report
                    ((ExpressionContext *)pSVar2,(SynBase *)pEVar1,
                     "ERROR: unary operation \'%s\' is not supported on \'%.*s\'",pcVar7,
                     (ulong)(uint)((int)(result->type->name).end - (int)(result->type->name).begin),
                     (result->type->name).begin);
          pEVar8 = ExpressionContext::get<ExprUnaryOp>((ExpressionContext *)syntax_local);
          pEVar1 = value;
          pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->
                    super_TypeBase;
          ExprUnaryOp::ExprUnaryOp
                    (pEVar8,(SynBase *)pEVar1,pTVar9,*(SynUnaryOpType *)&value[1].field_0xc,result);
          return &pEVar8->super_ExprBase;
        }
      }
      else {
        bVar3 = ExpressionContext::IsNumericType((ExpressionContext *)syntax_local,result->type);
        pSVar2 = syntax_local;
        pEVar1 = value;
        if (!bVar3) {
          pcVar7 = GetOpName(*(SynUnaryOpType *)&value[1].field_0xc);
          anon_unknown.dwarf_e7629::Report
                    ((ExpressionContext *)pSVar2,(SynBase *)pEVar1,
                     "ERROR: unary operation \'%s\' is not supported on \'%.*s\'",pcVar7,
                     (ulong)(uint)((int)(result->type->name).end - (int)(result->type->name).begin),
                     (result->type->name).begin);
          pEVar8 = ExpressionContext::get<ExprUnaryOp>((ExpressionContext *)syntax_local);
          pEVar1 = value;
          pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->
                    super_TypeBase;
          ExprUnaryOp::ExprUnaryOp
                    (pEVar8,(SynBase *)pEVar1,pTVar9,*(SynUnaryOpType *)&value[1].field_0xc,result);
          return &pEVar8->super_ExprBase;
        }
      }
    }
    if (bVar4) {
      local_50 = *(TypeBase **)&syntax_local[0x1e9].super_SynBase.listed;
    }
    else {
      local_50 = result->type;
    }
    pEVar10 = (ExpressionContext *)
              ExpressionContext::get<ExprUnaryOp>((ExpressionContext *)syntax_local);
    ExprUnaryOp::ExprUnaryOp
              ((ExprUnaryOp *)pEVar10,(SynBase *)value,local_50,
               *(SynUnaryOpType *)&value[1].field_0xc,result);
    ctx_local = pEVar10;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeUnaryOp(ExpressionContext &ctx, SynUnaryOp *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);

	if(!ctx.noUnaryOperatorForTypePair[int(syntax->type) - 1].contains(value->type))
	{
		if(ExprBase *result = CreateFunctionCall1(ctx, syntax, InplaceStr(GetOpName(syntax->type)), value, true, false, true))
			return result;
		else
			ctx.noUnaryOperatorForTypePair[int(syntax->type) - 1].insert(value->type);
	}

	AssertValueExpression(ctx, syntax, value);

	bool binaryOp = IsBinaryOp(syntax->type);
	bool logicalOp = IsLogicalOp(syntax->type);

	// Type check
	if(ctx.IsFloatingPointType(value->type))
	{
		if(binaryOp || logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(value->type == ctx.typeBool || value->type == ctx.typeAutoRef)
	{
		if(!logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		if(!logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(!ctx.IsNumericType(value->type))
	{
		Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
	}

	TypeBase *resultType = NULL;

	if(logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = value->type;

	return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, resultType, syntax->type, value);
}